

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seat.hpp
# Opt level: O1

void __thiscall
VIP::VIP(VIP *this,
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
        *PriceMap)

{
  string *byName;
  size_t sVar1;
  
  (this->super_seat)._vptr_seat = (_func_int **)&PTR___cxa_pure_virtual_00111c80;
  sVar1 = seat::Counter + 1;
  (this->super_seat).m_SeatID = seat::Counter;
  seat::Counter = sVar1;
  byName = &(this->super_seat).m_Name;
  (this->super_seat).m_Name._M_dataplus._M_p = (pointer)&(this->super_seat).m_Name.field_2;
  (this->super_seat).m_Name._M_string_length = 0;
  (this->super_seat).m_Name.field_2._M_local_buf[0] = '\0';
  (this->super_seat).Prices = PriceMap;
  (this->super_seat).TicketOwner.super___shared_ptr<Person,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_seat).TicketOwner.super___shared_ptr<Person,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_seat)._vptr_seat = (_func_int **)&PTR_initName_00111c30;
  std::__cxx11::string::_M_replace((ulong)byName,0,(char *)0x0,0x10e532);
  seat::initPrice(&this->super_seat,byName);
  return;
}

Assistant:

VIP(std::map<std::string, size_t> &PriceMap) : seat(PriceMap)
    {
        initName();
        initPrice(m_Name);
    }